

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multitexturedmesh.h
# Opt level: O3

void __thiscall
gvr::MultiTextureCoordReceiver::setValue
          (MultiTextureCoordReceiver *this,int instance,PLYValue *value)

{
  MultiTexturedMesh *pMVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  
  pMVar1 = this->p;
  (*value->_vptr_PLYValue[6])(value,0);
  pMVar1->uvt[instance].uv[0] = extraout_XMM0_Da;
  pMVar1 = this->p;
  (*value->_vptr_PLYValue[6])(value,1);
  pMVar1->uvt[instance].uv[1] = extraout_XMM0_Da_00;
  pMVar1 = this->p;
  (*value->_vptr_PLYValue[6])(value,2);
  pMVar1->uvt[instance].uv[2] = extraout_XMM0_Da_01;
  pMVar1 = this->p;
  (*value->_vptr_PLYValue[6])(value,3);
  pMVar1->uvt[instance].uv[3] = extraout_XMM0_Da_02;
  pMVar1 = this->p;
  (*value->_vptr_PLYValue[6])(value,4);
  pMVar1->uvt[instance].uv[4] = extraout_XMM0_Da_03;
  pMVar1 = this->p;
  (*value->_vptr_PLYValue[6])(value,5);
  pMVar1->uvt[instance].uv[5] = extraout_XMM0_Da_04;
  return;
}

Assistant:

void setValue(int instance, const PLYValue &value)
    {
      p.setTextureCoordComp(instance, 0, 0, value.getFloat(0));
      p.setTextureCoordComp(instance, 0, 1, value.getFloat(1));
      p.setTextureCoordComp(instance, 1, 0, value.getFloat(2));
      p.setTextureCoordComp(instance, 1, 1, value.getFloat(3));
      p.setTextureCoordComp(instance, 2, 0, value.getFloat(4));
      p.setTextureCoordComp(instance, 2, 1, value.getFloat(5));
    }